

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O1

void __thiscall TasGrid::GridSequence::differentiate(GridSequence *this,double *x,double *jacobian)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pointer pdVar4;
  long lVar5;
  pointer pdVar6;
  double *pdVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int j;
  ulong uVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  value_cache;
  vector<double,_std::allocator<double>_> diff_values;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  derivative_cache;
  allocator_type local_c1;
  double *local_c0;
  pointer local_b8;
  pointer local_b0;
  size_t local_a8;
  pointer local_a0;
  size_t local_98;
  long local_90;
  long local_88;
  pointer local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_c0 = jacobian;
  cacheBasisValues<double>(&local_78,this,x);
  cacheBasisDerivatives<double>(&local_48,this,x);
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_60,(long)(this->super_BaseCanonicalGrid).num_dimensions,&local_c1);
  uVar1 = (this->super_BaseCanonicalGrid).num_outputs;
  uVar2 = (this->super_BaseCanonicalGrid).num_dimensions;
  if (0 < (int)(uVar2 * uVar1)) {
    memset(local_c0,0,(ulong)(uVar2 * uVar1) << 3);
  }
  local_90 = (long)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if (0 < local_90) {
    uVar8 = (ulong)uVar2;
    local_98 = (this->super_BaseCanonicalGrid).points.num_dimensions;
    local_b8 = (this->super_BaseCanonicalGrid).points.indexes.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    local_a8 = (this->surpluses).stride;
    local_b0 = (this->surpluses).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_80 = local_48.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_a0 = ((local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    lVar5 = 0;
    do {
      local_88 = lVar5;
      lVar5 = local_98 * local_88;
      iVar3 = local_b8[lVar5];
      *local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = local_a0[iVar3];
      if (1 < (int)uVar2) {
        pdVar6 = ((local_78.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = 1;
        do {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar10] = pdVar6[iVar3];
          uVar10 = uVar10 + 1;
        } while (uVar8 != uVar10);
      }
      if (1 < (int)uVar2) {
        pdVar6 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar10 = uVar8;
        uVar9 = 1;
        do {
          iVar3 = local_b8[lVar5 + uVar9];
          pdVar4 = local_78.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar9].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = 0;
          do {
            local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] =
                 pdVar4[iVar3] *
                 local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar9 != uVar11);
          iVar3 = local_b8[lVar5 + uVar9];
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9] =
               local_48.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar9].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[iVar3] *
               local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
          uVar11 = uVar9 + 1;
          if ((long)uVar11 < (long)(int)uVar2) {
            pdVar4 = local_78.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar9].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = 2;
            do {
              pdVar6[uVar9] = pdVar4[iVar3] * pdVar6[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar10 != uVar9);
          }
          pdVar6 = pdVar6 + 1;
          uVar10 = uVar10 - 1;
          uVar9 = uVar11;
        } while (uVar11 != uVar8);
      }
      if (0 < (int)uVar1) {
        uVar10 = 0;
        pdVar7 = local_c0;
        do {
          if (0 < (int)uVar2) {
            uVar9 = 0;
            do {
              pdVar7[uVar9] =
                   local_b0[local_a8 * local_88 + uVar10] *
                   local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9] + pdVar7[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
          }
          uVar10 = uVar10 + 1;
          pdVar7 = pdVar7 + uVar8;
        } while (uVar10 != uVar1);
      }
      lVar5 = local_88 + 1;
    } while (local_88 + 1 != local_90);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_48);
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_78);
  return;
}

Assistant:

void GridSequence::differentiate(const double x[], double jacobian[]) const {
    // Based on the logic in the TasGrid::GridSequence::evaluate() and TasGrid::GridSequence::getDifferentiationWeights() functions.
    std::vector<std::vector<double>> value_cache = cacheBasisValues<double>(x);
    std::vector<std::vector<double>> derivative_cache = cacheBasisDerivatives<double>(x);
    std::vector<double> diff_values(num_dimensions);
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    int n = points.getNumIndexes();
    for(int i=0; i<n; i++) {
        const int* p = points.getIndex(i);
        const double *s = surpluses.getStrip(i);

        diff_values[0] = derivative_cache[0][p[0]];
        for(int j=1; j<num_dimensions; j++) diff_values[j] = value_cache[0][p[0]];

        for(int k=1; k<num_dimensions; k++) {
            for(int j=0; j<k; j++) diff_values[j] *= value_cache[k][p[k]];
            diff_values[k] *= derivative_cache[k][p[k]];
            for(int j=k+1; j<num_dimensions; j++) diff_values[j] *= value_cache[k][p[k]];
        }
        for(int k=0; k<num_outputs; k++)
            for(int j=0; j<num_dimensions; j++)
                jacobian[k * num_dimensions + j] += s[k] * diff_values[j];
    }
}